

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,REF_INT global0,REF_INT global1)

{
  uint uVar1;
  REF_STATUS local_70;
  REF_INT local_6c;
  int local_68;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT cell;
  REF_INT node;
  REF_INT item;
  REF_INT group;
  REF_INT part;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT global1_local;
  REF_INT global0_local;
  REF_SUBDIV ref_subdiv_local;
  
  ref_cell = (REF_CELL)ref_subdiv->grid->node;
  ref_node._0_4_ = global1;
  ref_node._4_4_ = global0;
  _global1_local = ref_subdiv;
  uVar1 = ref_node_local((REF_NODE)ref_cell,(long)global0,&edge);
  if ((uVar1 == 0) || (uVar1 == 5)) {
    uVar1 = ref_node_local((REF_NODE)ref_cell,(long)(REF_INT)ref_node,&part);
    if ((uVar1 == 0) || (uVar1 == 5)) {
      if ((edge == -1) || (part == -1)) {
        ref_subdiv_local._4_4_ = 0;
      }
      else {
        uVar1 = ref_edge_with(_global1_local->edge,edge,part,&group);
        if (uVar1 == 0) {
          uVar1 = ref_edge_part(_global1_local->edge,group,&item);
          if (uVar1 == 0) {
            printf(" mark %d edge %d rank %d part %d global %d %d\n",
                   (ulong)(uint)_global1_local->mark[group],(ulong)(uint)group,
                   (ulong)(uint)_global1_local->grid->mpi->id,(ulong)(uint)item,
                   (ulong)ref_node._4_4_,(REF_INT)ref_node);
            node = 8;
            _node1 = _global1_local->grid->cell[8];
            while (node < 0x10) {
              if ((edge < 0) || (_node1->ref_adj->nnode <= edge)) {
                local_68 = -1;
              }
              else {
                local_68 = _node1->ref_adj->first[edge];
              }
              cell = local_68;
              if (local_68 == -1) {
                local_6c = -1;
              }
              else {
                local_6c = _node1->ref_adj->item[local_68].ref;
              }
              ref_private_macro_code_rxs_1 = local_6c;
              while (cell != -1) {
                for (ref_private_macro_code_rxs = 0; ref_private_macro_code_rxs < _node1->node_per;
                    ref_private_macro_code_rxs = ref_private_macro_code_rxs + 1) {
                  if ((part == _node1->c2n
                               [ref_private_macro_code_rxs +
                                _node1->size_per * ref_private_macro_code_rxs_1]) &&
                     (uVar1 = ref_subdiv_inspect_cell
                                        (_global1_local,_node1,ref_private_macro_code_rxs_1),
                     uVar1 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x6c,"ref_subdiv_inspect_global",(ulong)uVar1,"insp");
                    return uVar1;
                  }
                }
                cell = _node1->ref_adj->item[cell].next;
                if (cell == -1) {
                  local_70 = -1;
                }
                else {
                  local_70 = _node1->ref_adj->item[cell].ref;
                }
                ref_private_macro_code_rxs_1 = local_70;
              }
              node = node + 1;
              _node1 = _global1_local->grid->cell[node];
            }
            ref_subdiv_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,100,"ref_subdiv_inspect_global",(ulong)uVar1,"part");
            ref_subdiv_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 99,"ref_subdiv_inspect_global",(ulong)uVar1,"with");
          ref_subdiv_local._4_4_ = uVar1;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x61
             ,"ref_subdiv_inspect_global",(ulong)uVar1,"g2l1");
      ref_subdiv_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x60,
           "ref_subdiv_inspect_global",(ulong)uVar1,"g2l0");
    ref_subdiv_local._4_4_ = uVar1;
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,
                                             REF_INT global0, REF_INT global1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell;
  REF_INT node0, node1;
  REF_INT edge, part;
  REF_INT group, item, node, cell;

  RXS(ref_node_local(ref_node, global0, &node0), REF_NOT_FOUND, "g2l0");
  RXS(ref_node_local(ref_node, global1, &node1), REF_NOT_FOUND, "g2l1");
  if (REF_EMPTY == node0 || REF_EMPTY == node1) return REF_SUCCESS;
  RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge), "with");
  RSS(ref_edge_part(ref_subdiv_edge(ref_subdiv), edge, &part), "part");

  printf(" mark %d edge %d rank %d part %d global %d %d\n",
         ref_subdiv_mark(ref_subdiv, edge), edge,
         ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), part, global0, global1);

  each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, node, cell) {
      RSS(ref_subdiv_inspect_cell(ref_subdiv, ref_cell, cell), "insp");
    }
  }

  return REF_SUCCESS;
}